

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QRectF * __thiscall
QGraphicsLineItem::boundingRect(QRectF *__return_storage_ptr__,QGraphicsLineItem *this)

{
  undefined1 auVar1 [16];
  QGraphicsItemPrivate *pQVar2;
  long in_FS_OFFSET;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  QPainterPath aQStack_28 [8];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QGraphicsItem).d_ptr.d;
  dVar3 = (double)QPen::widthF();
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    (*(this->super_QGraphicsItem)._vptr_QGraphicsItem[4])(aQStack_28,this);
    QPainterPath::controlPointRect();
    QPainterPath::~QPainterPath(aQStack_28);
  }
  else {
    auVar4._0_8_ = pQVar2[1]._vptr_QGraphicsItemPrivate;
    auVar4._8_8_ = pQVar2[1].extras.d.d;
    auVar1._0_8_ = pQVar2[1].extras.d.ptr;
    auVar1._8_8_ = pQVar2[1].extras.d.size;
    auVar5 = minpd(auVar4,auVar1);
    auVar4 = maxpd(auVar1,auVar4);
    __return_storage_ptr__->xp = (qreal)auVar5._0_8_;
    __return_storage_ptr__->yp = (qreal)auVar5._8_8_;
    __return_storage_ptr__->w = auVar4._0_8_ - auVar5._0_8_;
    __return_storage_ptr__->h = auVar4._8_8_ - auVar5._8_8_;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsLineItem::boundingRect() const
{
    Q_D(const QGraphicsLineItem);
    if (d->pen.widthF() == 0.0) {
        const qreal x1 = d->line.p1().x();
        const qreal x2 = d->line.p2().x();
        const qreal y1 = d->line.p1().y();
        const qreal y2 = d->line.p2().y();
        qreal lx = qMin(x1, x2);
        qreal rx = qMax(x1, x2);
        qreal ty = qMin(y1, y2);
        qreal by = qMax(y1, y2);
        return QRectF(lx, ty, rx - lx, by - ty);
    }
    return shape().controlPointRect();
}